

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMeans.cpp
# Opt level: O1

void __thiscall KMeans::~KMeans(KMeans *this)

{
  ~KMeans(this);
  operator_delete(this);
  return;
}

Assistant:

KMeans::~KMeans()
{    
}